

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

AActor * P_CheckOnmobj(AActor *thing)

{
  double dVar1;
  bool bVar2;
  AActor *pAVar3;
  AActor *onmobj;
  AActor *local_18;
  
  dVar1 = (thing->__Pos).Z;
  P_FakeZMovement(thing);
  bVar2 = P_TestMobjZ(thing,false,&local_18);
  (thing->__Pos).Z = dVar1;
  pAVar3 = (AActor *)0x0;
  if (!bVar2) {
    pAVar3 = local_18;
  }
  return pAVar3;
}

Assistant:

AActor *P_CheckOnmobj(AActor *thing)
{
	double oldz;
	bool good;
	AActor *onmobj;

	oldz = thing->Z();
	P_FakeZMovement(thing);
	good = P_TestMobjZ(thing, false, &onmobj);
	thing->SetZ(oldz);

	return good ? NULL : onmobj;
}